

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void helicsMessageSetOriginalSource(HelicsMessage message,char *src,HelicsError *err)

{
  Message *pMVar1;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pMVar1 = getMessageObj(message,err);
  if (pMVar1 != (Message *)0x0) {
    if (src == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_30,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,src,&local_31);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&pMVar1->original_source,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void helicsMessageSetOriginalSource(HelicsMessage message, const char* src, HelicsError* err)
{
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    mess->original_source = AS_STRING(src);
}